

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

QList<QAbstractButton_*> * __thiscall
QDialogButtonBoxPrivate::allButtons
          (QList<QAbstractButton_*> *__return_storage_ptr__,QDialogButtonBoxPrivate *this)

{
  long lVar1;
  long lVar2;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  visibleButtons(__return_storage_ptr__,this);
  QList<QAbstractButton_*>::reserve
            (__return_storage_ptr__,
             (this->hiddenButtons).c.keys.super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.s +
             (__return_storage_ptr__->d).size);
  lVar1 = (this->hiddenButtons).c.keys.super_QVLABase<QAbstractButton_*>.super_QVLABaseBase.s;
  for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    QList<QAbstractButton_*>::append
              (__return_storage_ptr__,
               *(parameter_type *)
                ((long)(this->hiddenButtons).c.keys.super_QVLABase<QAbstractButton_*>.
                       super_QVLABaseBase.ptr + lVar2 * 8));
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QAbstractButton *> QDialogButtonBoxPrivate::allButtons() const
{
    QList<QAbstractButton *> ret(visibleButtons());
    ret.reserve(ret.size() + hiddenButtons.size());
    for (const auto &it : hiddenButtons)
        ret.push_back(it.first);
    return ret;
}